

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io-unix.c++
# Opt level: O0

Promise<kj::Maybe<kj::AutoCloseFd>_> __thiscall
kj::anon_unknown_30::AsyncStreamFd::tryReceiveFdImpl<kj::AutoCloseFd>(AsyncStreamFd *this)

{
  int osErrorNumber;
  void *pvVar1;
  PromiseNode *extraout_RDX;
  PromiseNode *extraout_RDX_00;
  PromiseNode *extraout_RDX_01;
  PromiseNode *pPVar2;
  int in_ESI;
  Promise<kj::Maybe<kj::AutoCloseFd>_> PVar3;
  undefined1 local_130 [20];
  uint local_11c;
  int receivedFd;
  Fault f_4;
  Fault f_3;
  Fault f_2;
  Fault f_1;
  PropagateException local_e8 [8];
  undefined1 local_e0 [40];
  Fault f;
  SyscallResult local_94;
  undefined1 auStack_90 [4];
  SyscallResult _kjSyscallResult;
  ssize_t n;
  ArrayDisposer *pAStack_80;
  int recvmsgFlags;
  anon_union_24_2_c6a5a82d anon_var_1;
  char *pcStack_60;
  char c;
  iovec iov;
  msghdr msg;
  AsyncStreamFd *this_local;
  
  memset(&iov.iov_len,0,0x38);
  memset(&stack0xffffffffffffffa0,0,0x10);
  pcStack_60 = anon_var_1.cmsgSpace + 0x17;
  iov.iov_base = (void *)0x1;
  f.exception = (Exception *)auStack_90;
  local_94 = _::Debug::
             syscall<kj::(anonymous_namespace)::AsyncStreamFd::tryReceiveFdImpl<kj::AutoCloseFd>()::_lambda()_1_>
                       ((anon_class_32_4_2ad675aa *)&f,true);
  pvVar1 = _::Debug::SyscallResult::operator_cast_to_void_(&local_94);
  if (pvVar1 == (void *)0x0) {
    osErrorNumber = _::Debug::SyscallResult::getErrorNumber(&local_94);
    _::Debug::Fault::Fault
              ((Fault *)(local_e0 + 0x20),
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io-unix.c++"
               ,0x1d1,osErrorNumber,"n = recvmsg(fd, &msg, recvmsgFlags)","");
    _::Debug::Fault::fatal((Fault *)(local_e0 + 0x20));
  }
  if ((long)_auStack_90 < 0) {
    UnixEventPort::FdObserver::whenBecomesReadable((FdObserver *)local_e0);
    Promise<void>::
    then<kj::(anonymous_namespace)::AsyncStreamFd::tryReceiveFdImpl<kj::AutoCloseFd>()::_lambda()_2_,kj::_::PropagateException>
              ((Promise<void> *)this,(Type *)local_e0,local_e8);
    Promise<void>::~Promise((Promise<void> *)local_e0);
    pPVar2 = extraout_RDX;
  }
  else if (_auStack_90 == (char *)0x0) {
    Maybe<kj::AutoCloseFd>::Maybe((Maybe<kj::AutoCloseFd> *)&f_1,(void *)0x0);
    Promise<kj::Maybe<kj::AutoCloseFd>_>::Promise
              ((Promise<kj::Maybe<kj::AutoCloseFd>_> *)this,(Maybe<kj::AutoCloseFd> *)&f_1);
    Maybe<kj::AutoCloseFd>::~Maybe((Maybe<kj::AutoCloseFd> *)&f_1);
    pPVar2 = extraout_RDX_00;
  }
  else {
    if (anon_var_1.cmsg.cmsg_len._0_4_ != 1) {
      _::Debug::Fault::Fault
                (&f_3,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io-unix.c++"
                 ,0x1dd,FAILED,"cmsg.cmsg_level == SOL_SOCKET","");
      _::Debug::Fault::fatal(&f_3);
    }
    if (anon_var_1.cmsg.cmsg_len._4_4_ != 1) {
      _::Debug::Fault::Fault
                (&f_4,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io-unix.c++"
                 ,0x1de,FAILED,"cmsg.cmsg_type == SCM_RIGHTS","");
      _::Debug::Fault::fatal(&f_4);
    }
    if (pAStack_80 != (ArrayDisposer *)0x14) {
      _::Debug::Fault::Fault
                ((Fault *)&stack0xfffffffffffffee8,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io-unix.c++"
                 ,0x1df,FAILED,"cmsg.cmsg_len == CMSG_LEN(sizeof(int))","");
      _::Debug::Fault::fatal((Fault *)&stack0xfffffffffffffee8);
    }
    local_11c = anon_var_1.cmsg.cmsg_level;
    wrapFd((AsyncStreamFd *)local_130,in_ESI,(AutoCloseFd *)(ulong)(uint)anon_var_1.cmsg.cmsg_level)
    ;
    Maybe<kj::AutoCloseFd>::Maybe
              ((Maybe<kj::AutoCloseFd> *)(local_130 + 8),(AutoCloseFd *)local_130);
    Promise<kj::Maybe<kj::AutoCloseFd>_>::Promise
              ((Promise<kj::Maybe<kj::AutoCloseFd>_> *)this,
               (FixVoid<kj::Maybe<kj::AutoCloseFd>_> *)(local_130 + 8));
    Maybe<kj::AutoCloseFd>::~Maybe((Maybe<kj::AutoCloseFd> *)(local_130 + 8));
    AutoCloseFd::~AutoCloseFd((AutoCloseFd *)local_130);
    pPVar2 = extraout_RDX_01;
  }
  PVar3.super_PromiseBase.node.ptr = pPVar2;
  PVar3.super_PromiseBase.node.disposer = (Disposer *)this;
  return (Promise<kj::Maybe<kj::AutoCloseFd>_>)PVar3.super_PromiseBase.node;
}

Assistant:

kj::Promise<kj::Maybe<T>> tryReceiveFdImpl() {
    struct msghdr msg;
    memset(&msg, 0, sizeof(msg));

    struct iovec iov;
    memset(&iov, 0, sizeof(iov));
    char c;
    iov.iov_base = &c;
    iov.iov_len = 1;
    msg.msg_iov = &iov;
    msg.msg_iovlen = 1;

    // Allocate space to receive a cmsg.
    union {
      struct cmsghdr cmsg;
      char cmsgSpace[CMSG_SPACE(sizeof(int))];
    };
    msg.msg_control = &cmsg;
    msg.msg_controllen = sizeof(cmsgSpace);

#ifdef MSG_CMSG_CLOEXEC
    int recvmsgFlags = MSG_CMSG_CLOEXEC;
#else
    int recvmsgFlags = 0;
#endif

    ssize_t n;
    KJ_NONBLOCKING_SYSCALL(n = recvmsg(fd, &msg, recvmsgFlags));
    if (n < 0) {
      return observer.whenBecomesReadable().then([this]() {
        return tryReceiveFdImpl<T>();
      });
    } else if (n == 0) {
      return kj::Maybe<T>(nullptr);
    } else {
      KJ_REQUIRE(msg.msg_controllen >= sizeof(cmsg),
          "expected to receive FD over socket; received data instead");

      // We expect an SCM_RIGHTS message with a single FD.
      KJ_REQUIRE(cmsg.cmsg_level == SOL_SOCKET);
      KJ_REQUIRE(cmsg.cmsg_type == SCM_RIGHTS);
      KJ_REQUIRE(cmsg.cmsg_len == CMSG_LEN(sizeof(int)));

      int receivedFd;
      memcpy(&receivedFd, CMSG_DATA(&cmsg), sizeof(receivedFd));
      return kj::Maybe<T>(wrapFd(receivedFd, (T*)nullptr));
    }
  }